

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.h
# Opt level: O2

real_t __thiscall
xLearn::LinearScore::CalcScore(LinearScore *this,SparseRow *row,Model *model,real_t norm)

{
  undefined1 auVar1 [16];
  int iVar2;
  pointer pNVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = norm;
  auVar1 = vcvtusi2ss_avx512f(auVar4._0_16_,model->aux_size_);
  pNVar3 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = vcvttss2usi_avx512f(auVar1);
  auVar4 = ZEXT864(0) << 0x20;
  for (; pNVar3 != (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pNVar3 = pNVar3 + 1) {
    if (pNVar3->feat_id < model->num_feat_) {
      auVar1 = vfmadd231ss_fma(auVar4._0_16_,ZEXT416((uint)model->param_w_[pNVar3->feat_id * iVar2])
                               ,ZEXT416((uint)pNVar3->feat_val));
      auVar4 = ZEXT1664(auVar1);
    }
  }
  return auVar4._0_4_ + *model->param_b_;
}

Assistant:

inline real_t* GetParameter_w() { return param_w_; }